

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_update_info(bcf_hdr_t *hdr,bcf1_t *line,char *key,void *values,int n,int type)

{
  int *piVar1;
  ushort uVar2;
  uint8_t *puVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  anon_union_4_2_947300a4_for_v1 aVar7;
  int iVar8;
  bcf_info_t *pbVar9;
  byte *pbVar10;
  anon_union_4_2_947300a4_for_v1 *paVar11;
  size_t sVar12;
  void *values_00;
  byte bVar13;
  char cVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  char *key_00;
  ulong uVar19;
  void *pvVar20;
  bcf1_t *line_00;
  bcf_hdr_t *hdr_00;
  uint8_t *__dest;
  kstring_t str;
  kstring_t local_48;
  
  uVar15 = n;
  uVar5 = bcf_hdr_id2int(hdr,0,key);
  if ((int)uVar5 < 0) {
    return -1;
  }
  line_00 = (bcf1_t *)(ulong)uVar5;
  if ((~(hdr->id[0][(long)line_00].val)->info[1] & 0xf) == 0) {
    return -1;
  }
  if ((line->unpacked & 4) == 0) {
    bcf_unpack(line,4);
  }
  uVar18 = *(ulong *)&line->field_0x10;
  uVar6 = (uint)uVar18 & 0xffff;
  if ((uVar18 & 0xffff) == 0) {
    uVar16 = 0;
  }
  else {
    pbVar9 = (line->d).info;
    uVar16 = 0;
    do {
      if (uVar5 == pbVar9->key) goto LAB_00123390;
      uVar16 = uVar16 + 1;
      pbVar9 = pbVar9 + 1;
    } while ((uVar18 & 0xffff) != uVar16);
    uVar16 = (ulong)uVar6;
  }
LAB_00123390:
  if ((uint)uVar16 == uVar6) {
    pbVar9 = (bcf_info_t *)0x0;
  }
  else {
    pbVar9 = (line->d).info + (uVar16 & 0xffffffff);
  }
  if ((n == 0) ||
     (lVar17 = CONCAT71((int7)(uVar16 >> 8),values != (void *)0x0 || type != 3),
     values == (void *)0x0 && type == 3)) {
    if (pbVar9 == (bcf_info_t *)0x0) {
      return 0;
    }
    if ((int)*(uint *)&pbVar9->field_0x1c < 0) {
      free(pbVar9->vptr + -(ulong)(*(uint *)&pbVar9->field_0x1c & 0x7fffffff));
      pbVar9->field_0x1f = pbVar9->field_0x1f & 0x7f;
    }
    piVar1 = &(line->d).shared_dirty;
    *(byte *)piVar1 = (byte)*piVar1 | 8;
    pbVar9->vptr = (uint8_t *)0x0;
    return 0;
  }
  local_48.l = 0;
  local_48.m = 0;
  local_48.s = (char *)0x0;
  bcf_enc_int1(&local_48,uVar5);
  switch(type) {
  case 0:
  case 3:
    if (values == (void *)0x0) {
      bcf_enc_size(&local_48,0,0);
    }
    else {
      sVar12 = strlen((char *)values);
      bcf_enc_vchar(&local_48,(int)sVar12,(char *)values);
    }
    break;
  case 1:
    bcf_enc_vint(&local_48,n,(int32_t *)values,-1);
    break;
  case 2:
    bcf_enc_vfloat(&local_48,n,(float *)values);
    break;
  default:
    hdr_00 = (bcf_hdr_t *)(ulong)(uint)type;
    bcf_update_info_cold_1();
    if (uVar15 == 0) {
      iVar8 = bcf_update_format(hdr_00,line_00,key_00,(void *)0x0,0,3);
      return iVar8;
    }
    if ((int)uVar15 < 1) {
      uVar18 = 0;
    }
    else {
      uVar16 = 0;
      uVar18 = 0;
      do {
        sVar12 = strlen(*(char **)(lVar17 + uVar16 * 8));
        uVar19 = sVar12 & 0xffffffff;
        if ((int)sVar12 < (int)uVar18) {
          uVar19 = uVar18;
        }
        uVar18 = uVar19;
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    iVar8 = (int)uVar18;
    values_00 = malloc((long)(int)(iVar8 * uVar15));
    if (values_00 == (void *)0x0) {
      iVar8 = -2;
    }
    else {
      if (0 < (int)uVar15) {
        uVar16 = 0;
        pvVar20 = values_00;
        do {
          pcVar4 = *(char **)(lVar17 + uVar16 * 8);
          cVar14 = *pcVar4;
          uVar19 = 0;
          if (cVar14 != '\0') {
            uVar19 = 0;
            do {
              *(char *)((long)pvVar20 + uVar19) = cVar14;
              cVar14 = pcVar4[uVar19 + 1];
              uVar19 = uVar19 + 1;
            } while (cVar14 != '\0');
          }
          if ((int)(uint)uVar19 < iVar8) {
            memset((void *)((long)values_00 + (uVar19 & 0xffffffff) + (long)(iVar8 * (int)uVar16)),0
                   ,(ulong)(~(uint)uVar19 + iVar8) + 1);
          }
          uVar16 = uVar16 + 1;
          pvVar20 = (void *)((long)pvVar20 + uVar18);
        } while (uVar16 != uVar15);
      }
      iVar8 = bcf_update_format(hdr_00,line_00,key_00,values_00,iVar8 * uVar15,3);
      free(values_00);
    }
    return iVar8;
  }
  if (pbVar9 != (bcf_info_t *)0x0) {
    uVar18 = (ulong)((*(uint *)&pbVar9->field_0x1c & 0x7fffffff) + pbVar9->vptr_len);
    if (local_48.l <= uVar18) {
      if (local_48.l != uVar18) {
        piVar1 = &(line->d).shared_dirty;
        *(byte *)piVar1 = (byte)*piVar1 | 8;
      }
      puVar3 = pbVar9->vptr;
      uVar18 = (ulong)(*(uint *)&pbVar9->field_0x1c & 0x7fffffff);
      __dest = puVar3 + -uVar18;
      memcpy(__dest,local_48.s,local_48.l);
      free(local_48.s);
      bVar13 = puVar3[-uVar18] & 0xf;
      if (bVar13 == 2) {
        pbVar10 = __dest + 3;
        iVar8 = (int)*(short *)(__dest + 1);
      }
      else if (bVar13 == 1) {
        pbVar10 = __dest + 2;
        iVar8 = (int)(char)__dest[1];
      }
      else {
        pbVar10 = __dest + 5;
        iVar8 = *(int *)(__dest + 1);
      }
      uVar15 = *(uint *)&pbVar9->field_0x1c;
      pbVar9->key = iVar8;
      uVar5 = *pbVar10 & 0xf;
      pbVar9->type = uVar5;
      if (*pbVar10 < 0xf0) {
        paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 1);
        uVar6 = (uint)(*pbVar10 >> 4);
      }
      else if ((pbVar10[1] & 0xf) == 2) {
        uVar6 = (uint)*(short *)(pbVar10 + 2);
        paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 4);
      }
      else if ((pbVar10[1] & 0xf) == 1) {
        uVar6 = (uint)(char)pbVar10[2];
        paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 3);
      }
      else {
        uVar6 = *(uint *)(pbVar10 + 2);
        paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 6);
      }
      pbVar9->len = uVar6;
      pbVar9->vptr = (uint8_t *)paVar11;
      *(uint *)&pbVar9->field_0x1c = (int)paVar11 - (int)__dest & 0x7fffffff;
      (pbVar9->v1).i = 0;
      if (uVar6 != 1) goto switchD_001237aa_caseD_4;
      switch(uVar5) {
      case 1:
      case 7:
        aVar7 = (anon_union_4_2_947300a4_for_v1)(int)(char)*(byte *)paVar11;
        break;
      case 2:
        aVar7 = (anon_union_4_2_947300a4_for_v1)(int)*(short *)paVar11;
        break;
      case 3:
        aVar7 = *paVar11;
        break;
      default:
        goto switchD_001237aa_caseD_4;
      case 5:
        pbVar9->v1 = *paVar11;
        goto switchD_001237aa_caseD_4;
      }
      pbVar9->v1 = aVar7;
switchD_001237aa_caseD_4:
      pbVar9->vptr_len = uVar6 << (bcf_type_shift[uVar5] & 0x1f);
      *(uint *)&pbVar9->field_0x1c = *(uint *)&pbVar9->field_0x1c & 0x7fffffff | uVar15 & 0x80000000
      ;
      goto LAB_0012388a;
    }
    if ((int)*(uint *)&pbVar9->field_0x1c < 0) {
      __assert_fail("!inf->vptr_free",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                    ,0xa95,
                    "int bcf_update_info(const bcf_hdr_t *, bcf1_t *, const char *, const void *, int, int)"
                   );
    }
    if ((*local_48.s & 0xfU) == 2) {
      pbVar10 = (byte *)(local_48.s + 3);
      iVar8 = (int)*(short *)(local_48.s + 1);
    }
    else if ((*local_48.s & 0xfU) == 1) {
      pbVar10 = (byte *)(local_48.s + 2);
      iVar8 = (int)local_48.s[1];
    }
    else {
      pbVar10 = (byte *)(local_48.s + 5);
      iVar8 = *(int *)(local_48.s + 1);
    }
    pbVar9->key = iVar8;
    uVar15 = *pbVar10 & 0xf;
    pbVar9->type = uVar15;
    if (*pbVar10 < 0xf0) {
      paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 1);
      uVar5 = (uint)(*pbVar10 >> 4);
    }
    else if ((pbVar10[1] & 0xf) == 2) {
      uVar5 = (uint)*(short *)(pbVar10 + 2);
      paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 4);
    }
    else if ((pbVar10[1] & 0xf) == 1) {
      uVar5 = (uint)(char)pbVar10[2];
      paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 3);
    }
    else {
      uVar5 = *(uint *)(pbVar10 + 2);
      paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 6);
    }
    pbVar9->len = uVar5;
    pbVar9->vptr = (uint8_t *)paVar11;
    *(uint *)&pbVar9->field_0x1c = (int)paVar11 - (int)local_48.s & 0x7fffffff;
    (pbVar9->v1).i = 0;
    if (uVar5 != 1) goto switchD_00123801_caseD_4;
    switch(uVar15) {
    case 1:
    case 7:
      aVar7 = (anon_union_4_2_947300a4_for_v1)(int)(char)*(byte *)paVar11;
      break;
    case 2:
      aVar7 = (anon_union_4_2_947300a4_for_v1)(int)*(short *)paVar11;
      break;
    case 3:
      aVar7 = *paVar11;
      break;
    default:
      goto switchD_00123801_caseD_4;
    case 5:
      pbVar9->v1 = *paVar11;
      goto switchD_00123801_caseD_4;
    }
    pbVar9->v1 = aVar7;
switchD_00123801_caseD_4:
    pbVar9->vptr_len = uVar5 << (bcf_type_shift[uVar15] & 0x1f);
    pbVar9->field_0x1f = pbVar9->field_0x1f | 0x80;
    goto LAB_00123882;
  }
  uVar15 = *(int *)&line->field_0x10 + 1;
  uVar5 = uVar15 & 0xffff;
  *(short *)&line->field_0x10 = (short)uVar15;
  iVar8 = (line->d).m_info;
  if (iVar8 < (int)uVar5) {
    uVar5 = uVar5 - 1;
    uVar5 = (int)uVar5 >> 1 | uVar5;
    uVar5 = (int)uVar5 >> 2 | uVar5;
    uVar5 = (int)uVar5 >> 4 | uVar5;
    uVar5 = (int)uVar5 >> 8 | uVar5;
    uVar5 = (int)uVar5 >> 0x10 | uVar5;
    (line->d).m_info = uVar5 + 1;
    pbVar9 = (bcf_info_t *)realloc((line->d).info,(long)(int)uVar5 * 0x20 + 0x20);
    (line->d).info = pbVar9;
    memset(pbVar9 + iVar8,0,((long)(line->d).m_info - (long)iVar8) * 0x20);
  }
  uVar2 = *(ushort *)&line->field_0x10;
  pbVar9 = (line->d).info;
  if ((*local_48.s & 0xfU) == 2) {
    pbVar10 = (byte *)(local_48.s + 3);
    iVar8 = (int)*(short *)(local_48.s + 1);
  }
  else if ((*local_48.s & 0xfU) == 1) {
    pbVar10 = (byte *)(local_48.s + 2);
    iVar8 = (int)local_48.s[1];
  }
  else {
    pbVar10 = (byte *)(local_48.s + 5);
    iVar8 = *(int *)(local_48.s + 1);
  }
  pbVar9[(ulong)uVar2 - 1].key = iVar8;
  uVar15 = *pbVar10 & 0xf;
  pbVar9[(ulong)uVar2 - 1].type = uVar15;
  if (*pbVar10 < 0xf0) {
    paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 1);
    uVar5 = (uint)(*pbVar10 >> 4);
  }
  else if ((pbVar10[1] & 0xf) == 2) {
    uVar5 = (uint)*(short *)(pbVar10 + 2);
    paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 4);
  }
  else if ((pbVar10[1] & 0xf) == 1) {
    uVar5 = (uint)(char)pbVar10[2];
    paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 3);
  }
  else {
    uVar5 = *(uint *)(pbVar10 + 2);
    paVar11 = (anon_union_4_2_947300a4_for_v1 *)(pbVar10 + 6);
  }
  pbVar9[(ulong)uVar2 - 1].len = uVar5;
  pbVar9[(ulong)uVar2 - 1].vptr = (uint8_t *)paVar11;
  *(uint *)&pbVar9[(ulong)uVar2 - 1].field_0x1c = (int)paVar11 - (int)local_48.s & 0x7fffffff;
  pbVar9[(ulong)uVar2 - 1].v1.i = 0;
  if (uVar5 != 1) goto switchD_0012374e_caseD_4;
  switch(uVar15) {
  case 1:
  case 7:
    aVar7 = (anon_union_4_2_947300a4_for_v1)(int)(char)*(byte *)paVar11;
    break;
  case 2:
    aVar7 = (anon_union_4_2_947300a4_for_v1)(int)*(short *)paVar11;
    break;
  case 3:
    aVar7 = *paVar11;
    break;
  default:
    goto switchD_0012374e_caseD_4;
  case 5:
    pbVar9[(ulong)uVar2 - 1].v1 = *paVar11;
    goto switchD_0012374e_caseD_4;
  }
  pbVar9[(ulong)uVar2 - 1].v1 = aVar7;
switchD_0012374e_caseD_4:
  pbVar9[(ulong)uVar2 - 1].vptr_len = uVar5 << (bcf_type_shift[uVar15] & 0x1f);
  pbVar9[(ulong)uVar2 - 1].field_0x1f = pbVar9[(ulong)uVar2 - 1].field_0x1f | 0x80;
LAB_00123882:
  piVar1 = &(line->d).shared_dirty;
  *(byte *)piVar1 = (byte)*piVar1 | 8;
LAB_0012388a:
  *(byte *)&line->unpacked = (byte)line->unpacked | 4;
  return 0;
}

Assistant:

int bcf_update_info(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const void *values, int n, int type)
{
    // Is the field already present?
    int i, inf_id = bcf_hdr_id2int(hdr,BCF_DT_ID,key);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_INFO,inf_id) ) return -1;    // No such INFO field in the header
    if ( !(line->unpacked & BCF_UN_INFO) ) bcf_unpack(line, BCF_UN_INFO);

    for (i=0; i<line->n_info; i++)
        if ( inf_id==line->d.info[i].key ) break;
    bcf_info_t *inf = i==line->n_info ? NULL : &line->d.info[i];

    if ( !n || (type==BCF_HT_STR && !values) )
    {
        if ( inf )
        {
            // Mark the tag for removal, free existing memory if necessary
            if ( inf->vptr_free )
            {
                free(inf->vptr - inf->vptr_off);
                inf->vptr_free = 0;
            }
            line->d.shared_dirty |= BCF1_DIRTY_INF;
            inf->vptr = NULL;
        }
        return 0;
    }

    // Encode the values and determine the size required to accommodate the values
    kstring_t str = {0,0,0};
    bcf_enc_int1(&str, inf_id);
    if ( type==BCF_HT_INT )
        bcf_enc_vint(&str, n, (int32_t*)values, -1);
    else if ( type==BCF_HT_REAL )
        bcf_enc_vfloat(&str, n, (float*)values);
    else if ( type==BCF_HT_FLAG || type==BCF_HT_STR )
    {
        if ( values==NULL )
            bcf_enc_size(&str, 0, BCF_BT_NULL);
        else
            bcf_enc_vchar(&str, strlen((char*)values), (char*)values);
    }
    else
    {
        fprintf(stderr, "[E::%s] the type %d not implemented yet\n", __func__, type);
        abort();
    }

    // Is the INFO tag already present
    if ( inf )
    {
        // Is it big enough to accommodate new block?
        if ( str.l <= inf->vptr_len + inf->vptr_off )
        {
            if ( str.l != inf->vptr_len + inf->vptr_off ) line->d.shared_dirty |= BCF1_DIRTY_INF;
            uint8_t *ptr = inf->vptr - inf->vptr_off;
            memcpy(ptr, str.s, str.l);
            free(str.s);
            int vptr_free = inf->vptr_free;
            bcf_unpack_info_core1(ptr, inf);
            inf->vptr_free = vptr_free;
        }
        else
        {
            assert( !inf->vptr_free );  // fix the caller or improve here: this has been modified before
            bcf_unpack_info_core1((uint8_t*)str.s, inf);
            inf->vptr_free = 1;
            line->d.shared_dirty |= BCF1_DIRTY_INF;
        }
    }
    else
    {
        // The tag is not present, create new one
        line->n_info++;
        hts_expand0(bcf_info_t, line->n_info, line->d.m_info , line->d.info);
        inf = &line->d.info[line->n_info-1];
        bcf_unpack_info_core1((uint8_t*)str.s, inf);
        inf->vptr_free = 1;
        line->d.shared_dirty |= BCF1_DIRTY_INF;
    }
    line->unpacked |= BCF_UN_INFO;
    return 0;
}